

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

optional<common::PSBTError> __thiscall
wallet::CWallet::FillPSBT
          (CWallet *this,PartiallySignedTransaction *psbtx,bool *complete,int sighash_type,bool sign
          ,bool bip32derivs,size_t *n_signed,bool finalize)

{
  bool bVar1;
  PartiallySignedTransaction *psbtx_00;
  PartiallySignedTransaction *pPVar2;
  pointer pvVar3;
  reference ppSVar4;
  undefined4 extraout_var;
  size_type sVar5;
  _Optional_payload_base<common::PSBTError> _Var6;
  uint in_ECX;
  byte *in_RDX;
  undefined8 in_RSI;
  byte in_R8B;
  byte in_R9B;
  long in_FS_OFFSET;
  long *in_stack_00000008;
  byte in_stack_00000010;
  size_t i_1;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  CWalletTx *wtx;
  uint256 *txhash;
  PSBTInput *input;
  CTxIn *txin;
  uint i;
  int n_signed_this_spkm;
  iterator __end1;
  iterator __begin1;
  const_iterator it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock47;
  optional<common::PSBTError> error;
  PrecomputedTransactionData txdata;
  PSBTInput *in_stack_fffffffffffffc68;
  uint in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc8b;
  int in_stack_fffffffffffffc8c;
  char *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffca0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  CWallet *in_stack_fffffffffffffcb8;
  PartiallySignedTransaction *in_stack_fffffffffffffce0;
  ulong uVar7;
  ulong uVar8;
  undefined4 in_stack_fffffffffffffcf0;
  int iVar9;
  undefined1 *puVar10;
  PartiallySignedTransaction *in_stack_fffffffffffffd00;
  uint local_2d0;
  int local_2ac;
  iterator local_2a8;
  iterator local_2a0;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_298;
  undefined8 local_290;
  undefined4 local_284;
  undefined8 local_270;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_stack_00000008 != (long *)0x0) {
    *in_stack_00000008 = 0;
  }
  local_284 = in_ECX;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,(bool)in_stack_fffffffffffffc8b);
  local_2d0 = 0;
  while( true ) {
    psbtx_00 = (PartiallySignedTransaction *)(ulong)local_2d0;
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)in_stack_fffffffffffffc68);
    pPVar2 = (PartiallySignedTransaction *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffc68);
    if (pPVar2 <= psbtx_00) break;
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)in_stack_fffffffffffffc68);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              (in_stack_fffffffffffffc78,
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    in_stack_fffffffffffffcb8 =
         (CWallet *)
         std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at
                   ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffc78,
                    CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    in_stack_fffffffffffffcb7 = PSBTInputSigned(in_stack_fffffffffffffc68);
    if ((!(bool)in_stack_fffffffffffffcb7) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           in_stack_fffffffffffffc68), !bVar1)) {
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_fffffffffffffc68);
      local_290 = std::
                  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                  ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         (key_type *)in_stack_fffffffffffffc68);
      local_298._M_cur =
           (__node_type *)
           std::
           unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      bVar1 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                         in_stack_fffffffffffffc78,
                         (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                         CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar3 = std::__detail::
                 _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
                 operator->((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                             *)in_stack_fffffffffffffc68);
        in_stack_fffffffffffffd00 = (PartiallySignedTransaction *)&pvVar3->second;
        std::shared_ptr<const_CTransaction>::operator=
                  ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc78,
                   (shared_ptr<const_CTransaction> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      }
    }
    local_2d0 = local_2d0 + 1;
  }
  PrecomputePSBTData(in_stack_fffffffffffffce0);
  GetAllScriptPubKeyMans(in_stack_fffffffffffffcb8);
  puVar10 = &stack0xfffffffffffffea0;
  local_2a0 = std::
              set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                       *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_2a8 = std::
              set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                     *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  do {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffc78,
                            (_Self *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      iVar9 = 5;
LAB_001b500f:
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)in_stack_fffffffffffffc68);
      if (iVar9 == 5) {
        RemoveUnnecessaryTransactions(psbtx_00,(int *)in_stack_fffffffffffffcb8);
        *in_RDX = 1;
        uVar7 = 0;
        while (uVar8 = uVar7,
              sVar5 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::size
                                ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)
                                 in_stack_fffffffffffffc68), uVar7 < sVar5) {
          PartiallySignedTransaction::PartiallySignedTransaction
                    ((PartiallySignedTransaction *)in_stack_fffffffffffffcb8,
                     (PartiallySignedTransaction *)
                     CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
          bVar1 = PSBTInputSignedAndVerified
                            (in_stack_fffffffffffffd00,(uint)((ulong)puVar10 >> 0x20),
                             (PrecomputedTransactionData *)CONCAT44(iVar9,in_stack_fffffffffffffcf0)
                            );
          *in_RDX = (*in_RDX & 1 & bVar1) != 0;
          PartiallySignedTransaction::~PartiallySignedTransaction
                    ((PartiallySignedTransaction *)in_stack_fffffffffffffc68);
          uVar7 = uVar8 + 1;
        }
        std::optional<common::PSBTError>::optional
                  ((optional<common::PSBTError> *)in_stack_fffffffffffffc68);
      }
      PrecomputedTransactionData::~PrecomputedTransactionData
                ((PrecomputedTransactionData *)in_stack_fffffffffffffc68);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      _Var6._M_payload = local_270._0_4_;
      _Var6._M_engaged = (bool)local_270._4_1_;
      _Var6._5_3_ = local_270._5_3_;
      return (optional<common::PSBTError>)_Var6;
    }
    ppSVar4 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         in_stack_fffffffffffffc68);
    local_2ac = 0;
    in_stack_fffffffffffffc70 = (uint)(in_stack_00000010 & 1);
    in_stack_fffffffffffffc68 = (PSBTInput *)&stack0xfffffffffffffd54;
    local_270._0_4_ =
         (*(*ppSVar4)->_vptr_ScriptPubKeyMan[0x19])
                   (*ppSVar4,in_RSI,&stack0xfffffffffffffed0,(ulong)(uint)local_284,
                    (ulong)(in_R8B & 1),(ulong)(in_R9B & 1));
    local_270._4_4_ = extraout_var;
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<common::PSBTError> *)in_stack_fffffffffffffc68);
    if (bVar1) {
      iVar9 = 1;
      goto LAB_001b500f;
    }
    if (in_stack_00000008 != (long *)0x0) {
      *in_stack_00000008 = (long)local_2ac + *in_stack_00000008;
    }
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_fffffffffffffc68);
  } while( true );
}

Assistant:

std::optional<PSBTError> CWallet::FillPSBT(PartiallySignedTransaction& psbtx, bool& complete, int sighash_type, bool sign, bool bip32derivs, size_t * n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    LOCK(cs_wallet);
    // Get all of the previous transactions
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // If we have no utxo, grab it from the wallet.
        if (!input.non_witness_utxo) {
            const uint256& txhash = txin.prevout.hash;
            const auto it = mapWallet.find(txhash);
            if (it != mapWallet.end()) {
                const CWalletTx& wtx = it->second;
                // We only need the non_witness_utxo, which is a superset of the witness_utxo.
                //   The signing code will switch to the smaller witness_utxo if this is ok.
                input.non_witness_utxo = wtx.tx;
            }
        }
    }

    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);

    // Fill in information from ScriptPubKeyMans
    for (ScriptPubKeyMan* spk_man : GetAllScriptPubKeyMans()) {
        int n_signed_this_spkm = 0;
        const auto error{spk_man->FillPSBT(psbtx, txdata, sighash_type, sign, bip32derivs, &n_signed_this_spkm, finalize)};
        if (error) {
            return error;
        }

        if (n_signed) {
            (*n_signed) += n_signed_this_spkm;
        }
    }

    RemoveUnnecessaryTransactions(psbtx, sighash_type);

    // Complete if every input is now signed
    complete = true;
    for (size_t i = 0; i < psbtx.inputs.size(); ++i) {
        complete &= PSBTInputSignedAndVerified(psbtx, i, &txdata);
    }

    return {};
}